

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3GenerateColumnNames(Parse *pParse,Select *pSelect)

{
  Vdbe *p_00;
  sqlite3 *db_00;
  SrcList *pTabList_00;
  ExprList *pEList_00;
  ulong uVar1;
  Expr *pEVar2;
  Table *pTVar3;
  char *pcVar4;
  bool bVar5;
  char *local_90;
  char *z;
  char *zName_1;
  char *pcStack_68;
  int iCol;
  char *zCol;
  char *zName;
  Expr *p;
  int srcName;
  int fullName;
  sqlite3 *db;
  ExprList *pEList;
  SrcList *pTabList;
  Table *pTab;
  int i;
  Vdbe *v;
  Select *pSelect_local;
  Parse *pParse_local;
  
  p_00 = pParse->pVdbe;
  db_00 = pParse->db;
  v = (Vdbe *)pSelect;
  if (pParse->colNamesSet == '\0') {
    for (; v->nFkConstraint != 0; v = (Vdbe *)v->nFkConstraint) {
    }
    pTabList_00 = *(SrcList **)&v->nCursor;
    pEList_00 = *(ExprList **)&v->nVar;
    pParse->colNamesSet = '\x01';
    bVar5 = (db_00->flags & 4) == 0;
    uVar1 = db_00->flags;
    sqlite3VdbeSetNumCols(p_00,pEList_00->nExpr);
    for (pTab._4_4_ = 0; pTab._4_4_ < pEList_00->nExpr; pTab._4_4_ = pTab._4_4_ + 1) {
      pEVar2 = pEList_00->a[pTab._4_4_].pExpr;
      if ((pEList_00->a[pTab._4_4_].zEName == (char *)0x0) ||
         ((*(ushort *)&pEList_00->a[pTab._4_4_].fg.field_0x1 & 3) != 0)) {
        if (((uVar1 & 0x40) == 0 && bVar5) || (pEVar2->op != 0xa7)) {
          pcVar4 = pEList_00->a[pTab._4_4_].zEName;
          if (pcVar4 == (char *)0x0) {
            local_90 = sqlite3MPrintf(db_00,"column%d",(ulong)(pTab._4_4_ + 1));
          }
          else {
            local_90 = sqlite3DbStrDup(db_00,pcVar4);
          }
          sqlite3VdbeSetColName(p_00,pTab._4_4_,0,local_90,sqlite3OomClear);
        }
        else {
          zName_1._4_4_ = (int)pEVar2->iColumn;
          pTVar3 = (pEVar2->y).pTab;
          if (zName_1._4_4_ < 0) {
            zName_1._4_4_ = (int)pTVar3->iPKey;
          }
          if (zName_1._4_4_ < 0) {
            pcStack_68 = "rowid";
          }
          else {
            pcStack_68 = pTVar3->aCol[zName_1._4_4_].zCnName;
          }
          if (bVar5) {
            sqlite3VdbeSetColName
                      (p_00,pTab._4_4_,0,pcStack_68,(_func_void_void_ptr *)0xffffffffffffffff);
          }
          else {
            pcVar4 = sqlite3MPrintf(db_00,"%s.%s",pTVar3->zName,pcStack_68);
            sqlite3VdbeSetColName(p_00,pTab._4_4_,0,pcVar4,sqlite3OomClear);
          }
        }
      }
      else {
        sqlite3VdbeSetColName
                  (p_00,pTab._4_4_,0,pEList_00->a[pTab._4_4_].zEName,
                   (_func_void_void_ptr *)0xffffffffffffffff);
      }
    }
    generateColumnTypes(pParse,pTabList_00,pEList_00);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3GenerateColumnNames(
  Parse *pParse,      /* Parser context */
  Select *pSelect     /* Generate column names for this SELECT statement */
){
  Vdbe *v = pParse->pVdbe;
  int i;
  Table *pTab;
  SrcList *pTabList;
  ExprList *pEList;
  sqlite3 *db = pParse->db;
  int fullName;    /* TABLE.COLUMN if no AS clause and is a direct table ref */
  int srcName;     /* COLUMN or TABLE.COLUMN if no AS clause and is direct */

  if( pParse->colNamesSet ) return;
  /* Column names are determined by the left-most term of a compound select */
  while( pSelect->pPrior ) pSelect = pSelect->pPrior;
  TREETRACE(0x80,pParse,pSelect,("generating column names\n"));
  pTabList = pSelect->pSrc;
  pEList = pSelect->pEList;
  assert( v!=0 );
  assert( pTabList!=0 );
  pParse->colNamesSet = 1;
  fullName = (db->flags & SQLITE_FullColNames)!=0;
  srcName = (db->flags & SQLITE_ShortColNames)!=0 || fullName;
  sqlite3VdbeSetNumCols(v, pEList->nExpr);
  for(i=0; i<pEList->nExpr; i++){
    Expr *p = pEList->a[i].pExpr;

    assert( p!=0 );
    assert( p->op!=TK_AGG_COLUMN );  /* Agg processing has not run yet */
    assert( p->op!=TK_COLUMN
        || (ExprUseYTab(p) && p->y.pTab!=0) ); /* Covering idx not yet coded */
    if( pEList->a[i].zEName && pEList->a[i].fg.eEName==ENAME_NAME ){
      /* An AS clause always takes first priority */
      char *zName = pEList->a[i].zEName;
      sqlite3VdbeSetColName(v, i, COLNAME_NAME, zName, SQLITE_TRANSIENT);
    }else if( srcName && p->op==TK_COLUMN ){
      char *zCol;
      int iCol = p->iColumn;
      pTab = p->y.pTab;
      assert( pTab!=0 );
      if( iCol<0 ) iCol = pTab->iPKey;
      assert( iCol==-1 || (iCol>=0 && iCol<pTab->nCol) );
      if( iCol<0 ){
        zCol = "rowid";
      }else{
        zCol = pTab->aCol[iCol].zCnName;
      }
      if( fullName ){
        char *zName = 0;
        zName = sqlite3MPrintf(db, "%s.%s", pTab->zName, zCol);
        sqlite3VdbeSetColName(v, i, COLNAME_NAME, zName, SQLITE_DYNAMIC);
      }else{
        sqlite3VdbeSetColName(v, i, COLNAME_NAME, zCol, SQLITE_TRANSIENT);
      }
    }else{
      const char *z = pEList->a[i].zEName;
      z = z==0 ? sqlite3MPrintf(db, "column%d", i+1) : sqlite3DbStrDup(db, z);
      sqlite3VdbeSetColName(v, i, COLNAME_NAME, z, SQLITE_DYNAMIC);
    }
  }
  generateColumnTypes(pParse, pTabList, pEList);
}